

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver_strategies.cpp
# Opt level: O3

bool __thiscall Clasp::UserConfiguration::addPost(UserConfiguration *this,Solver *s)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  PostPropagator *pPVar4;
  Lookahead *this_00;
  Params local_24;
  long lVar3;
  
  iVar2 = (*(this->super_Configuration)._vptr_Configuration[6])(this,(ulong)s->strategy_ >> 0x3a);
  lVar3 = CONCAT44(extraout_var,iVar2);
  bVar1 = true;
  if ((*(ushort *)(lVar3 + 0x1a) & 3) - 1 < 3) {
    pPVar4 = Solver::getPost(s,0x3ff);
    if (pPVar4 != (PostPropagator *)0x0) {
      (*(pPVar4->super_Constraint)._vptr_Constraint[5])(pPVar4,s,1);
    }
    local_24.lim = *(uint *)(lVar3 + 0x18) & 0xffff;
    local_24.type = *(uint *)(lVar3 + 0x18) >> 0x10 & Hybrid;
    local_24.topLevelImps = true;
    local_24.restrictNant = (bool)((byte)(*(uint *)(lVar3 + 8) >> 0x15) & 1);
    this_00 = (Lookahead *)operator_new(0x88);
    Lookahead::Lookahead(this_00,&local_24);
    bVar1 = Solver::addPost(s,(PostPropagator *)this_00);
  }
  return bVar1;
}

Assistant:

bool UserConfiguration::addPost(Solver& s) const {
	const SolverOpts& x = solver(s.id());
	bool  ok            = true;
	if (Lookahead::isType(x.lookType)) {
		PostPropagator* pp = s.getPost(PostPropagator::priority_reserved_look);
		if (pp) { pp->destroy(&s, true); }
		Lookahead::Params p(static_cast<VarType>(x.lookType));
		p.nant(x.heuristic.nant != 0);
		p.limit(x.lookOps);
		ok = s.addPost(new Lookahead(p));
	}
	return ok;
}